

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O0

void Abc_TruthNpnPerform(Abc_TtStore_t *p,int NpnType,int fVerbose)

{
  uint uVar1;
  abctime aVar2;
  permInfo *x;
  Abc_TtHieMan_t *pAVar3;
  abctime aVar4;
  char *pcVar5;
  Abc_TtHieMan_t *pMan_2;
  Abc_TtHieMan_t *pMan_1;
  int iEnumThres;
  int fHigh;
  Abc_TtHieMan_t *pMan;
  int fExact;
  permInfo *pi;
  char *pAlgoName;
  int i;
  abctime clk;
  char local_6028 [4];
  uint uCanonPhase;
  char pCanonPerm [16];
  word pAuxWord1 [1024];
  word pAuxWord [1024];
  uint pAux [2048];
  int fVerbose_local;
  int NpnType_local;
  Abc_TtStore_t *p_local;
  
  clk._4_4_ = 0;
  aVar2 = Abc_Clock();
  pi = (permInfo *)0x0;
  if (NpnType == 0) {
    pi = (permInfo *)anon_var_dwarf_b556d;
  }
  else if (NpnType == 1) {
    pi = (permInfo *)anon_var_dwarf_b5577;
  }
  else if (NpnType == 2) {
    pi = (permInfo *)anon_var_dwarf_b5581;
  }
  else if (NpnType == 3) {
    pi = (permInfo *)anon_var_dwarf_b558b;
  }
  else if (NpnType == 4) {
    pi = (permInfo *)anon_var_dwarf_b5595;
  }
  else if (NpnType == 5) {
    pi = (permInfo *)anon_var_dwarf_b559f;
  }
  else if (NpnType == 6) {
    pi = (permInfo *)anon_var_dwarf_b55a9;
  }
  else if (NpnType == 7) {
    pi = (permInfo *)anon_var_dwarf_b55b3;
  }
  else if (NpnType == 8) {
    pi = (permInfo *)anon_var_dwarf_b55bd;
  }
  else if (NpnType == 9) {
    pi = (permInfo *)anon_var_dwarf_b55c7;
  }
  else if (NpnType == 10) {
    pi = (permInfo *)anon_var_dwarf_b55dd;
  }
  else if (NpnType == 0xb) {
    pi = (permInfo *)anon_var_dwarf_b55e7;
  }
  if (p->nVars < 0x11) {
    if (pi != (permInfo *)0x0) {
      pcVar5 = "s";
      if (p->nFuncs == 1) {
        pcVar5 = "";
      }
      printf("Applying %-20s to %8d func%s of %2d vars...  ",pi,(ulong)(uint)p->nFuncs,pcVar5,
             (ulong)(uint)p->nVars);
    }
    if (fVerbose != 0) {
      printf("\n");
    }
    if (NpnType == 0) {
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          printf("\n");
        }
      }
    }
    else if (NpnType == 1) {
      Abc_TruthNpnCountUnique(p);
      x = setPermInfoPtr(p->nVars);
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        simpleMinimal(p->pFuncs[(int)pAlgoName._4_4_],pAuxWord1 + 0x3ff,(word *)(pCanonPerm + 8),x,
                      p->nVars);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint(local_6028,0,p->nVars);
          printf("\n");
        }
      }
      freePermInfoPtr(x);
    }
    else if (NpnType == 2) {
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        resetPCanonPermArray(local_6028,p->nVars);
        uVar1 = Kit_TruthSemiCanonicize
                          ((uint *)p->pFuncs[(int)pAlgoName._4_4_],(uint *)(pAuxWord + 0x3ff),
                           p->nVars,local_6028);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint(local_6028,uVar1,p->nVars);
          printf("\n");
        }
      }
    }
    else if (NpnType == 3) {
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        resetPCanonPermArray(local_6028,p->nVars);
        uVar1 = luckyCanonicizer_final_fast(p->pFuncs[(int)pAlgoName._4_4_],p->nVars,local_6028);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint(local_6028,uVar1,p->nVars);
          printf("\n");
        }
      }
    }
    else if (NpnType == 4) {
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        resetPCanonPermArray(local_6028,p->nVars);
        uVar1 = luckyCanonicizer_final_fast1(p->pFuncs[(int)pAlgoName._4_4_],p->nVars,local_6028);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint(local_6028,uVar1,p->nVars);
          printf("\n");
        }
      }
    }
    else if (NpnType == 5) {
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        uVar1 = Abc_TtCanonicize(p->pFuncs[(int)pAlgoName._4_4_],p->nVars,local_6028);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint(local_6028,uVar1,p->nVars);
          printf("\n");
        }
      }
    }
    else if (NpnType == 6) {
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        uVar1 = Abc_TtCanonicizePhase(p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint((char *)0x0,uVar1,p->nVars);
          printf("\n");
        }
      }
    }
    else if (NpnType == 7) {
      pAVar3 = Abc_TtHieManStart(p->nVars,5);
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        Abc_TtCanonicizeHie(pAVar3,p->pFuncs[(int)pAlgoName._4_4_],p->nVars,local_6028,0);
        if (fVerbose != 0) {
          printf("\n");
        }
      }
      Abc_TtHieManStop(pAVar3);
    }
    else if (NpnType == 8) {
      pAVar3 = Abc_TtHieManStart(p->nVars,5);
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        uVar1 = Abc_TtCanonicizeWrap
                          (Abc_TtCanonicizeAda,pAVar3,p->pFuncs[(int)pAlgoName._4_4_],p->nVars,
                           local_6028,0x7d);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint(local_6028,uVar1,p->nVars);
          printf("\n");
        }
      }
      Abc_TtHieManStop(pAVar3);
    }
    else {
      if (((NpnType != 9) && (NpnType != 10)) && (NpnType != 0xb)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNpn.c"
                      ,0x167,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
      }
      pAVar3 = Abc_TtHieManStart(p->nVars,5);
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        if (NpnType == 9) {
          clk._4_4_ = Abc_TtCanonicizeWrap
                                (Abc_TtCanonicizeAda,pAVar3,p->pFuncs[(int)pAlgoName._4_4_],p->nVars
                                 ,local_6028,0x7d);
        }
        else if (NpnType == 10) {
          clk._4_4_ = Abc_TtCanonicizeWrap
                                (Abc_TtCanonicizeAda,pAVar3,p->pFuncs[(int)pAlgoName._4_4_],p->nVars
                                 ,local_6028,0x4af);
        }
        else if (NpnType == 0xb) {
          clk._4_4_ = Abc_TtCanonicizeWrap
                                (Abc_TtCanonicizeCA,pAVar3,p->pFuncs[(int)pAlgoName._4_4_],p->nVars,
                                 local_6028,1);
        }
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint(local_6028,clk._4_4_,p->nVars);
          printf("\n");
        }
      }
      Abc_TtHieManStop(pAVar3);
    }
    aVar4 = Abc_Clock();
    uVar1 = Abc_TruthNpnCountUnique(p);
    printf("Classes =%9d  ",(ulong)uVar1);
    Abc_PrintTime(1,"Time",aVar4 - aVar2);
    return;
  }
  __assert_fail("p->nVars <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNpn.c"
                ,0xd4,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
}

Assistant:

void Abc_TruthNpnPerform( Abc_TtStore_t * p, int NpnType, int fVerbose )
{
    unsigned pAux[2048];
    word pAuxWord[1024], pAuxWord1[1024];
    char pCanonPerm[16];
    unsigned uCanonPhase=0;
    abctime clk = Abc_Clock();
    int i;

    char * pAlgoName = NULL;
    if ( NpnType == 0 )
        pAlgoName = "uniqifying          ";
    else if ( NpnType == 1 )
        pAlgoName = "exact NPN           ";
    else if ( NpnType == 2 )
        pAlgoName = "counting 1s         ";
    else if ( NpnType == 3 )
        pAlgoName = "Jake's hybrid fast  ";
    else if ( NpnType == 4 )
        pAlgoName = "Jake's hybrid good  ";
    else if ( NpnType == 5 )
        pAlgoName = "new hybrid fast     ";
    else if ( NpnType == 6 )
        pAlgoName = "new phase flipping  ";
    else if ( NpnType == 7 )
        pAlgoName = "new hier. matching  ";
    else if ( NpnType == 8 )
        pAlgoName = "new adap. matching  ";
    else if ( NpnType == 9 )
        pAlgoName = "adjustable algorithm (heuristic) ";
    else if ( NpnType == 10 )
        pAlgoName = "adjustable algorithm (exact)     ";
    else if ( NpnType == 11 )
        pAlgoName = "new cost-aware exact algorithm   ";

    assert( p->nVars <= 16 );
    if ( pAlgoName )
        printf( "Applying %-20s to %8d func%s of %2d vars...  ",  
            pAlgoName, p->nFuncs, (p->nFuncs == 1 ? "":"s"), p->nVars );
    if ( fVerbose )
        printf( "\n" );

    if ( NpnType == 0 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), printf( "\n" );
        }
    }
    else if ( NpnType == 1 )
    {
        permInfo* pi; 
        Abc_TruthNpnCountUnique(p);
        pi = setPermInfoPtr(p->nVars);
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            simpleMinimal(p->pFuncs[i], pAuxWord, pAuxWord1, pi, p->nVars);
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
        freePermInfoPtr(pi);
    }
    else if ( NpnType == 2 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pFuncs[i], pAux, p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 3 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 4 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast1( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 5 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicize( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 6 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizePhase( p->pFuncs[i], p->nVars );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 7 )
    {
        int fExact = 0;
		Abc_TtHieMan_t * pMan = Abc_TtHieManStart( p->nVars, 5 );
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizeHie( pMan, p->pFuncs[i], p->nVars, pCanonPerm, fExact );
            if ( fVerbose )
//                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
                printf( "\n" );
        }
        // nClasses = Abc_TtManNumClasses( pMan );
		Abc_TtHieManStop( pMan );
    }
    else if ( NpnType == 8 )
    {
//        typedef unsigned(*TtCanonicizeFunc)(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeWrap(TtCanonicizeFunc func, Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeAda(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int iThres);
		
		int fHigh = 1, iEnumThres = 25;
		Abc_TtHieMan_t * pMan = Abc_TtHieManStart(p->nVars, 5);
		for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda, pMan, p->pFuncs[i], p->nVars, pCanonPerm, fHigh*100 + iEnumThres);
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
		Abc_TtHieManStop(pMan);
    }
    else if ( NpnType == 9 || NpnType == 10 || NpnType == 11 )
    {
//        typedef unsigned(*TtCanonicizeFunc)(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeWrap(TtCanonicizeFunc func, Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeAda(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int iThres);
        unsigned Abc_TtCanonicizeCA(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int iThres);
		
		Abc_TtHieMan_t * pMan = Abc_TtHieManStart(p->nVars, 5);
		for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            if ( NpnType == 9 )
                uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda, pMan, p->pFuncs[i], p->nVars, pCanonPerm,  125); // -A 8, adjustable algorithm (heuristic)
            else if ( NpnType == 10 )
                uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda, pMan, p->pFuncs[i], p->nVars, pCanonPerm, 1199); // -A 9, adjustable algorithm (exact)
            else if ( NpnType == 11 )
                uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeCA,  pMan, p->pFuncs[i], p->nVars, pCanonPerm,    1); // -A 10, new cost-aware exact algorithm
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
		Abc_TtHieManStop(pMan);
    }
    else assert( 0 );
    clk = Abc_Clock() - clk;
    printf( "Classes =%9d  ", Abc_TruthNpnCountUnique(p) );
    Abc_PrintTime( 1, "Time", clk );
}